

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O2

void plug_graveyard(CHAR_DATA *ch,int type)

{
  return;
}

Assistant:

void plug_graveyard(CHAR_DATA *ch, int type)
{
	int minlevel = 30, day, tid, i, max;
	char buf[MSL], buf2[MSL], name[MSL], message[MSL], message_date[MSL], stid[MSL];
	char align[MSL], ethos[MSL], type_death[MSL], message_death[MSL];
	char *suf;
	char ntime[MSL], year[MSL], month[MSL], dom[MSL], time[MSL], cur_date[MSL], unique[MSL];
	MYSQL_ROW qrow;

	return;

	if (ch->level < minlevel)
		return;

	day = time_info.day + 1;

	if (day > 4 && day < 20)
		suf = "th";
	else if (day % 10 == 1)
		suf = "st";
	else if (day % 10 == 2)
		suf = "nd";
	else if (day % 10 == 3)
		suf = "rd";
	else
		suf = "th";

	sprintf(message_date, "On the Day %s, %d%s of the Month %s, in the Year %d,",
		day_name[day % 6],
		day,
		suf,
		month_name[time_info.month],
		time_info.year);

	if (type == 1)
	{
		sprintf(type_death, "DEL");
		sprintf(message_death, "took %s own life.", (ch->sex == 2) ? "her" : "his");
	}
	else if (type == 2)
	{
		sprintf(type_death, "CON");
		sprintf(message_death, "perished in battle.");
	}
	else if (type == 3)
	{
		sprintf(type_death, "AGE");
		sprintf(message_death, "perished of old age.");
	}
	else
	{
		sprintf(type_death, "AUTO");
		sprintf(message_death, "perished in %s sleep.", (ch->sex == 2) ? "her" : "his");
	}

	strftime(month, 200, "%m", localtime(&current_time));
	strftime(dom, 200, "%d", localtime(&current_time));
	strftime(time, 200, "%H:%M:%S", localtime(&current_time));
	strftime(ntime, 200, "%H%M%S", localtime(&current_time));
	strftime(year, 200, "%Y", localtime(&current_time));

	qrow = one_fquery_row("select max(zthreadid) from gabe20010201051916");

	if (qrow[0] != nullptr)
	{
		sprintf(stid, "%15.0f", (float)(atoi(qrow[0]) + 1));

		for (i = 0; stid[i] != '\0'; i++)
		{
			if (stid[i] == ' ')
				stid[i] = '0';
		}
	}
	else
	{
		sprintf(stid, "000000000000000");
	}

	sprintf(cur_date, "%s/%s/%s %s", month, dom, year, time);
	sprintf(unique, "%s%s%s%s", year, month, dom, ntime);
	sprintf(name, "(%s) %s%s", type_death, ch->true_name, ch->pcdata->title);
	if (ch->pcdata->extitle != nullptr)
		sprintf(name, "%s%s", name, ch->pcdata->extitle);

	/* Message */
	if (ch->alignment == 1000)
		sprintf(align, "Good");
	else if (ch->alignment == 0)
		sprintf(align, "Neutral");
	else
		sprintf(align, "Evil");
	if (ch->pcdata->ethos == 1000)
		sprintf(ethos, "Lawful");
	else if (ch->pcdata->ethos == 0)
		sprintf(ethos, "Neutral");
	else
		sprintf(ethos, "Chaotic");

	sprintf(message, "%s %s %s\n\r%s%s", message_date, ch->true_name, message_death, ch->true_name, ch->pcdata->title);

	if (ch->pcdata->extitle != nullptr)
		sprintf(message, "%s%s", message, ch->pcdata->extitle);

	sprintf(message, "%s\rLevel: %d\rAge: %d %s years old, born in the Caelumaedani year %d.\rHours: %d\rRace: %s\rSex: %s\rClass: %s\r",
		message,
		ch->level,
		get_age(ch),
		pc_race_table[ch->race].race_time,
		ch->pcdata->birth_date,
		get_hours(ch),
		race_table[ch->race].name,
		sex_table[ch->sex].name,
		(RSTR)ch->Class()->name);

	if (ch->Class()->GetIndex() == CLASS_WARRIOR)
	{
		sprintf(message, "%sStyle Specializations: ", message);

		for (i = 1; i < MAX_STYLE; i++)
		{
			if (IS_SET(ch->pcdata->styles, style_table[i].bit))
			{
				sprintf(message, "%s%s ", message, style_table[i].name);
			}
		}

		sprintf(message, "%s\r", message);
	}
	else if (ch->Class()->GetIndex() == CLASS_SORCERER)
	{
		sprintf(message, "%s%s's major elemental focus was %s and %s para-elemental focus was %s.\r",
			message,
			ch->true_name,
			sphere_table[ch->pcdata->ele_major].name,
			(ch->sex == 2) ? "her" : "his",
			sphere_table[ch->pcdata->ele_para].name);
	}

	sprintf(message, "%sAlignment: %s\rEthos: %s", message, align, ethos);

	if (ch->cabal)
	{
		sprintf(message, "%s\rCabal: %s, %s", message, cabal_table[ch->cabal].who_name, cabal_table[ch->cabal].long_name);
		if (ch->cabal == CABAL_HORDE && ch->pcdata->tribe)
			sprintf(message, "%s, of the %s Tribe", message, palloc_string(capitalize(tribe_table[ch->pcdata->tribe].name)));
	}

	if ((ch->pcdata->frags[PK_KILLS] + ch->pcdata->fragged) > 0)
		sprintf(message, "%s\rPK Ratio: %.2f%%", message, (ch->pcdata->frags[PK_KILLS] * 100 / (ch->pcdata->frags[PK_KILLS] + ch->pcdata->fragged)));
	else
		sprintf(message, "%s\rPK Ratio: 0%%", message);

	sprintf(buf2,
			"insert into graveyard(Pname, Pfrags, Pfgood, Pfneutral, Pfevil, Pfdeaths, Pmdeaths, Phours) "\
			"values('%s',%.3f, %.3f, %.3f, %.3f, %.3f, %d, %d)",\
			ch->true_name, ch->pcdata->frags[PK_KILLS], ch->pcdata->frags[PK_GOOD], ch->pcdata->frags[PK_NEUTRAL],
			ch->pcdata->frags[PK_EVIL], ch->pcdata->fragged, ch->pcdata->killed[MOB_KILLED], get_hours(ch));
	one_query(buf2);

	sprintf(buf,
			"insert into gabe20010201051916(zposter,zposter_email,zsubject,zmessage,zdatetime,zaddress,zunique,"\
			"zthreadid,zdelete,zmod) values('Death_Wizard','immortals@riftshadow.com','%s','%s',"\
			"'%s','localhost',%s,'%s',0,'Death_Wizard')",
			name, message, cur_date, unique, stid);
	one_fquery(buf);
}